

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fixed_size_uncompressed.cpp
# Opt level: O2

void duckdb::FixedSizeScan<int>
               (ColumnSegment *segment,ColumnScanState *state,idx_t scan_count,Vector *result)

{
  idx_t iVar1;
  idx_t iVar2;
  idx_t iVar3;
  pointer pSVar4;
  data_ptr_t pdVar5;
  
  pSVar4 = unique_ptr<duckdb::SegmentScanState,_std::default_delete<duckdb::SegmentScanState>,_true>
           ::operator->(&state->scan_state);
  iVar1 = state->row_index;
  iVar2 = (segment->super_SegmentBase<duckdb::ColumnSegment>).start;
  pdVar5 = BufferHandle::Ptr((BufferHandle *)(pSVar4 + 1));
  iVar3 = segment->offset;
  Vector::SetVectorType(result,FLAT_VECTOR);
  result->data = pdVar5 + (iVar1 - iVar2) * 4 + iVar3;
  return;
}

Assistant:

void FixedSizeScan(ColumnSegment &segment, ColumnScanState &state, idx_t scan_count, Vector &result) {
	auto &scan_state = state.scan_state->template Cast<FixedSizeScanState>();
	auto start = segment.GetRelativeIndex(state.row_index);

	auto data = scan_state.handle.Ptr() + segment.GetBlockOffset();
	auto source_data = data + start * sizeof(T);

	result.SetVectorType(VectorType::FLAT_VECTOR);
	FlatVector::SetData(result, source_data);
}